

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O3

void duckdb::GetSortKeyLengthList<duckdb::SortKeyArrayEntry>
               (SortKeyVectorData *vector_data,SortKeyChunk chunk,SortKeyLengthInfo *result)

{
  pointer puVar1;
  sel_t *psVar2;
  SortKeyChunk chunk_00;
  reference this;
  idx_t iVar3;
  type vector_data_00;
  ulong uVar4;
  ulong uVar5;
  undefined7 uStack_37;
  
  this = vector<duckdb::unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>,_true>
         ::operator[](&vector_data->child_data,0);
  if (chunk.start < chunk.end) {
    do {
      psVar2 = ((vector_data->format).sel)->sel_vector;
      uVar4 = chunk.start;
      if (psVar2 != (sel_t *)0x0) {
        uVar4 = (ulong)psVar2[chunk.start];
      }
      uVar5 = chunk.start;
      if (chunk.has_result_index != false) {
        uVar5 = chunk.result_index;
      }
      puVar1 = (result->variable_lengths).
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      *puVar1 = *puVar1 + 1;
      iVar3 = ArrayType::GetSize(&vector_data->vec->type);
      puVar1 = (result->variable_lengths).
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start + uVar5;
      *puVar1 = *puVar1 + 1;
      if (iVar3 != 0) {
        vector_data_00 =
             unique_ptr<duckdb::SortKeyVectorData,_std::default_delete<duckdb::SortKeyVectorData>,_true>
             ::operator*(this);
        chunk_00._25_7_ = uStack_37;
        chunk_00.has_result_index = true;
        chunk_00.end = iVar3 + uVar4 * iVar3;
        chunk_00.start = uVar4 * iVar3;
        chunk_00.result_index = uVar5;
        GetSortKeyLengthRecursive(vector_data_00,chunk_00,result);
      }
      chunk.start = chunk.start + 1;
    } while (chunk.end != chunk.start);
  }
  return;
}

Assistant:

void GetSortKeyLengthList(SortKeyVectorData &vector_data, SortKeyChunk chunk, SortKeyLengthInfo &result) {
	auto &child_data = vector_data.child_data[0];
	for (idx_t r = chunk.start; r < chunk.end; r++) {
		auto idx = vector_data.format.sel->get_index(r);
		auto result_index = chunk.GetResultIndex(r);
		result.variable_lengths[result_index]++; // every list is prefixed by a validity byte

		if (!vector_data.format.validity.RowIsValid(idx)) {
			if (!OP::IsArray()) {
				// for arrays we need to fill in the child vector for all elements, even if the top-level array is NULL
				continue;
			}
		}
		auto list_entry = OP::GetListEntry(vector_data, idx);
		// for each non-null list we have an "end of list" delimiter
		result.variable_lengths[result_index]++;
		if (list_entry.length > 0) {
			// recursively call GetSortKeyLength for the children of this list
			SortKeyChunk child_chunk(list_entry.offset, list_entry.offset + list_entry.length, result_index);
			GetSortKeyLengthRecursive(*child_data, child_chunk, result);
		}
	}
}